

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2dense.c
# Opt level: O0

void mod2dense_copy(mod2dense *m,mod2dense *r)

{
  int *in_RSI;
  int *in_RDI;
  int j;
  int k;
  int local_18;
  int local_14;
  
  if ((*in_RDI <= *in_RSI) && (in_RDI[1] <= in_RSI[1])) {
    for (local_18 = 0; local_18 < in_RDI[1]; local_18 = local_18 + 1) {
      for (local_14 = 0; local_14 < in_RDI[2]; local_14 = local_14 + 1) {
        *(undefined4 *)(*(long *)(*(long *)(in_RSI + 4) + (long)local_18 * 8) + (long)local_14 * 4)
             = *(undefined4 *)
                (*(long *)(*(long *)(in_RDI + 4) + (long)local_18 * 8) + (long)local_14 * 4);
      }
      for (; local_14 < in_RSI[2]; local_14 = local_14 + 1) {
        *(undefined4 *)(*(long *)(*(long *)(in_RSI + 4) + (long)local_18 * 8) + (long)local_14 * 4)
             = 0;
      }
    }
    for (; local_18 < in_RSI[1]; local_18 = local_18 + 1) {
      for (local_14 = 0; local_14 < in_RSI[2]; local_14 = local_14 + 1) {
        *(undefined4 *)(*(long *)(*(long *)(in_RSI + 4) + (long)local_18 * 8) + (long)local_14 * 4)
             = 0;
      }
    }
    return;
  }
  fprintf(_stderr,"mod2dense_copy: Destination matrix is too small\n");
  exit(1);
}

Assistant:

void mod2dense_copy
( mod2dense *m,		/* Matrix to copy */
  mod2dense *r		/* Place to store copy of matrix */
)
{ 
  int k, j;

  if (mod2dense_rows(m)>mod2dense_rows(r) 
   || mod2dense_cols(m)>mod2dense_cols(r))
  { fprintf(stderr,"mod2dense_copy: Destination matrix is too small\n");
    exit(1);
  }

  for (j = 0; j<mod2dense_cols(m); j++)
  { for (k = 0; k<m->n_words; k++)
    { r->col[j][k] = m->col[j][k];
    }
    for ( ; k<r->n_words; k++)
    { r->col[j][k] = 0;
    }
  }

  for ( ; j<mod2dense_cols(r); j++)
  { for (k = 0; k<r->n_words; k++)
    { r->col[j][k] = 0;
    }
  }
}